

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_summon_named(command *cmd)

{
  uint32_t *puVar1;
  loc grid;
  _Bool _Var2;
  wchar_t wVar3;
  monster_race *race;
  char *fmt;
  int iVar4;
  bool bVar5;
  wchar_t r_idx;
  char s [80];
  
  wVar3 = cmd_get_arg_number((command_conflict *)cmd,"index",&r_idx);
  if (wVar3 == L'\0') {
    if ((0 < (long)r_idx) && ((uint)r_idx < (uint)z_info->r_max)) {
      race = r_info + r_idx;
      goto LAB_00134127;
    }
  }
  else {
    s[0x40] = '\0';
    s[0x41] = '\0';
    s[0x42] = '\0';
    s[0x43] = '\0';
    s[0x44] = '\0';
    s[0x45] = '\0';
    s[0x46] = '\0';
    s[0x47] = '\0';
    s[0x48] = '\0';
    s[0x49] = '\0';
    s[0x4a] = '\0';
    s[0x4b] = '\0';
    s[0x4c] = '\0';
    s[0x4d] = '\0';
    s[0x4e] = '\0';
    s[0x4f] = '\0';
    s[0x30] = '\0';
    s[0x31] = '\0';
    s[0x32] = '\0';
    s[0x33] = '\0';
    s[0x34] = '\0';
    s[0x35] = '\0';
    s[0x36] = '\0';
    s[0x37] = '\0';
    s[0x38] = '\0';
    s[0x39] = '\0';
    s[0x3a] = '\0';
    s[0x3b] = '\0';
    s[0x3c] = '\0';
    s[0x3d] = '\0';
    s[0x3e] = '\0';
    s[0x3f] = '\0';
    s[0x20] = '\0';
    s[0x21] = '\0';
    s[0x22] = '\0';
    s[0x23] = '\0';
    s[0x24] = '\0';
    s[0x25] = '\0';
    s[0x26] = '\0';
    s[0x27] = '\0';
    s[0x28] = '\0';
    s[0x29] = '\0';
    s[0x2a] = '\0';
    s[0x2b] = '\0';
    s[0x2c] = '\0';
    s[0x2d] = '\0';
    s[0x2e] = '\0';
    s[0x2f] = '\0';
    s[0x10] = '\0';
    s[0x11] = '\0';
    s[0x12] = '\0';
    s[0x13] = '\0';
    s[0x14] = '\0';
    s[0x15] = '\0';
    s[0x16] = '\0';
    s[0x17] = '\0';
    s[0x18] = '\0';
    s[0x19] = '\0';
    s[0x1a] = '\0';
    s[0x1b] = '\0';
    s[0x1c] = '\0';
    s[0x1d] = '\0';
    s[0x1e] = '\0';
    s[0x1f] = '\0';
    s[0] = '\0';
    s[1] = '\0';
    s[2] = '\0';
    s[3] = '\0';
    s[4] = '\0';
    s[5] = '\0';
    s[6] = '\0';
    s[7] = '\0';
    s[8] = '\0';
    s[9] = '\0';
    s[10] = '\0';
    s[0xb] = '\0';
    s[0xc] = '\0';
    s[0xd] = '\0';
    s[0xe] = '\0';
    s[0xf] = '\0';
    _Var2 = get_string("Summon which monster? ",s,0x50);
    if (!_Var2) {
      return;
    }
    _Var2 = get_int_from_string(s,&r_idx);
    if (_Var2) {
      if ((0 < (long)r_idx) && ((uint)r_idx < (uint)z_info->r_max)) {
        race = r_info + r_idx;
        goto LAB_0013410c;
      }
    }
    else {
      race = lookup_monster(s);
LAB_0013410c:
      if (race != (monster_race *)0x0) {
        cmd_set_arg_number((command_conflict *)cmd,"index",race->ridx);
        goto LAB_00134127;
      }
    }
    race = (monster_race *)0x0;
LAB_00134127:
    if (race != (monster_race *)0x0) {
      iVar4 = 10;
      while ((bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5 &&
             (grid.x = (player->grid).x, grid.y = (player->grid).y,
             wVar3 = scatter_ext(cave,(loc *)s,L'\x01',grid,L'\x01',true,square_isempty),
             wVar3 != L'\0'))) {
        _Var2 = place_new_monster((chunk *)cave,(loc_conflict)s._0_8_,race,true,true,
                                  (monster_group_info)0x0,'\x19');
        if (_Var2) {
          puVar1 = &player->upkeep->redraw;
          *puVar1 = *puVar1 | 0x410000;
          return;
        }
      }
      fmt = "Could not place monster.";
      goto LAB_001341c3;
    }
  }
  fmt = "No monster found.";
LAB_001341c3:
  msg(fmt);
  return;
}

Assistant:

void do_cmd_wiz_summon_named(struct command *cmd)
{
	int r_idx, i = 0;
	struct monster_race *r = NULL;
	struct monster_group_info info = { 0, 0 };

	if (cmd_get_arg_number(cmd, "index", &r_idx) == CMD_OK) {
		if (r_idx > 0 && r_idx < z_info->r_max) {
			r = &r_info[r_idx];
		}
	} else {
		char s[80] = "";

		if (!get_string("Summon which monster? ", s, sizeof(s))) return;
		/* See if an index was entered */
		if (get_int_from_string(s, &r_idx)) {
			if (r_idx > 0 && r_idx < z_info->r_max) {
				r = &r_info[r_idx];
			}
		} else {
			/* If not, find by name */
			r = lookup_monster(s);
		}
		if (r != NULL) {
			cmd_set_arg_number(cmd, "index", r->ridx);
		}
	}

	if (r == NULL) {
		msg("No monster found.");
		return;
	}

	/* Try 10 times */
	while (1) {
		struct loc grid;

		/* Pick an empty location. */
		if (i >= 10 || scatter_ext(cave, &grid, 1, player->grid, 1,
				true, square_isempty) == 0) {
			msg("Could not place monster.");
			break;
		}

		/* Try to place. */
		if (place_new_monster(cave, grid, r, true, true,
				info, ORIGIN_DROP_WIZARD)) {
			player->upkeep->redraw |= PR_MAP | PR_MONLIST;
			break;
		}

		++i;
	}
}